

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O3

void __thiscall
LoudnessMeter::LoudnessAnalyzer::Init
          (LoudnessAnalyzer *this,float lengthInSeconds,float updateRateInHz,float attackTime,
          float releaseTime,float samplerate)

{
  float fVar1;
  
  fVar1 = powf(0.01,1.0 / (attackTime * samplerate));
  this->attack = 1.0 - fVar1;
  fVar1 = powf(0.01,1.0 / (releaseTime * samplerate));
  this->release = 1.0 - fVar1;
  this->updateperiod = samplerate / updateRateInHz;
  fVar1 = ceilf(lengthInSeconds * updateRateInHz);
  HistoryBuffer::Init(&this->peakbuf,(int)fVar1);
  HistoryBuffer::Init(&this->rmsbuf,(int)fVar1);
  return;
}

Assistant:

void Init(float lengthInSeconds, float updateRateInHz, float attackTime, float releaseTime, float samplerate)
        {
            attack = 1.0f - powf(0.01f, 1.0f / (samplerate * attackTime));
            release = 1.0f - powf(0.01f, 1.0f / (samplerate * releaseTime));
            updateperiod = samplerate / updateRateInHz;
            int length = (int)ceilf(lengthInSeconds * updateRateInHz);
            peakbuf.Init(length);
            rmsbuf.Init(length);
        }